

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderStatus.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::Mode5TransponderStatus::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Mode5TransponderStatus *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Mode5TransponderStatus *local_18;
  Mode5TransponderStatus *this_local;
  
  local_18 = this;
  this_local = (Mode5TransponderStatus *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Mode 5 Transponder Status:");
  poVar1 = std::operator<<(poVar1,"\n\tReply:                   ");
  ENUMS::GetEnumAsStringMode5Reply_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)((this->m_StatusUnion).m_ui16Status & 0xf),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\n\tLine Test:               ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((byte)((this->m_StatusUnion).m_ui16Status >> 4) & 1));
  poVar1 = std::operator<<(poVar1,"\n\tAntenna Selection:       ");
  ENUMS::GetEnumAsStringAntennaSelection_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)((this->m_StatusUnion).m_ui16Status >> 5 & 3),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n\tCrypto Control:          ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((byte)((this->m_StatusUnion).m_ui16Status >> 7) & 1));
  poVar1 = std::operator<<(poVar1,"\n\tLocation Included:       ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((byte)((this->m_StatusUnion).m_ui16Status >> 8) & 1));
  poVar1 = std::operator<<(poVar1,"\n\tLocation Error Included: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((byte)((this->m_StatusUnion).m_ui16Status >> 9) & 1));
  poVar1 = std::operator<<(poVar1,"\n\tPlatform Type:           ");
  ENUMS::GetEnumAsStringPlatformType_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)((this->m_StatusUnion).m_ui16Status >> 10 & 1),Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"\n\tLevel 2 Included:        ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((byte)((this->m_StatusUnion).m_ui16Status >> 0xb) & 1));
  poVar1 = std::operator<<(poVar1,"\n\tOn/Off Status:           ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((byte)((this->m_StatusUnion).m_ui16Status >> 0xd) & 1));
  poVar1 = std::operator<<(poVar1,"\n\tDamaged:                 ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(bool)((byte)((this->m_StatusUnion).m_ui16Status >> 0xe) & 1));
  poVar1 = std::operator<<(poVar1,"\n\tMalfunction:             ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,SUB21((this->m_StatusUnion).m_ui16Status >> 0xf,0));
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Mode5TransponderStatus::GetAsString() const
{
    KStringStream ss;	

	ss << "Mode 5 Transponder Status:"
	   << "\n\tReply:                   " << GetEnumAsStringMode5Reply( m_StatusUnion.m_ui16Reply )
	   << "\n\tLine Test:               " << ( KBOOL )m_StatusUnion.m_ui16LineTst
	   << "\n\tAntenna Selection:       " << GetEnumAsStringAntennaSelection( m_StatusUnion.m_ui16AntennaSel )
	   << "\n\tCrypto Control:          " << ( KBOOL )m_StatusUnion.m_ui16CryptoCtrl
	   << "\n\tLocation Included:       " << ( KBOOL )m_StatusUnion.m_ui16LatLonAltSrc
	   << "\n\tLocation Error Included: " << ( KBOOL )m_StatusUnion.m_ui16LocErrs
	   << "\n\tPlatform Type:           " << GetEnumAsStringPlatformType( m_StatusUnion.m_ui16PlatfrmTyp )
	   << "\n\tLevel 2 Included:        " << ( KBOOL )m_StatusUnion.m_ui16LvlSel
	   << "\n\tOn/Off Status:           " << ( KBOOL )m_StatusUnion.m_ui16OnOff
	   << "\n\tDamaged:                 " << ( KBOOL )m_StatusUnion.m_ui16Dmg
	   << "\n\tMalfunction:             " << ( KBOOL )m_StatusUnion.m_ui16MalFnc 
	   << "\n";

    return ss.str();
}